

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

int main_internal(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  EVP_PKEY_CTX *in_RDI;
  crunch converter;
  corpus_tester tester;
  corpus_gen generator;
  bool status;
  dynamic_string cmd_line;
  char *in_stack_000002c0;
  corpus_gen *in_stack_000002c8;
  char *in_stack_000003f0;
  crunch *in_stack_000003f8;
  char *in_stack_00000530;
  corpus_tester *in_stack_00000538;
  crunch *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  crunch *in_stack_fffffffffffffee0;
  corpus_tester *in_stack_fffffffffffffef0;
  char **in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  dynamic_string *in_stack_ffffffffffffff30;
  corpus_gen local_2e;
  byte local_2d;
  dynamic_string local_20;
  undefined4 local_4;
  
  local_4 = SUB84(in_RDI,0);
  crnlib::colorized_console::init(in_RDI);
  bVar2 = check_for_option((int)in_stack_fffffffffffffee0,
                           (char **)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                           (char *)in_stack_fffffffffffffed0);
  if (bVar2) {
    crnlib::console::disable_output();
  }
  bVar2 = check_for_option((int)in_stack_fffffffffffffee0,
                           (char **)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                           (char *)in_stack_fffffffffffffed0);
  if (!bVar2) {
    print_title();
  }
  crnlib::dynamic_string::dynamic_string(&local_20);
  crnlib::get_command_line_as_single_string
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
  local_2d = 0;
  bVar2 = check_for_option((int)in_stack_fffffffffffffee0,
                           (char **)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                           (char *)in_stack_fffffffffffffed0);
  if (bVar2) {
    crnlib::corpus_gen::corpus_gen(&local_2e);
    crnlib::dynamic_string::get_ptr(&local_20);
    local_2d = crnlib::corpus_gen::generate(in_stack_000002c8,in_stack_000002c0);
  }
  else {
    bVar2 = check_for_option((int)in_stack_fffffffffffffee0,
                             (char **)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                             (char *)in_stack_fffffffffffffed0);
    if (bVar2) {
      crnlib::corpus_tester::corpus_tester(in_stack_fffffffffffffef0);
      crnlib::dynamic_string::get_ptr(&local_20);
      local_2d = crnlib::corpus_tester::test(in_stack_00000538,in_stack_00000530);
      crnlib::corpus_tester::~corpus_tester((corpus_tester *)0x10ea6e);
    }
    else {
      crunch::crunch(in_stack_fffffffffffffee0);
      in_stack_fffffffffffffed0 = (crunch *)crnlib::dynamic_string::get_ptr(&local_20);
      local_2d = crunch::convert(in_stack_000003f8,in_stack_000003f0);
      crunch::~crunch(in_stack_fffffffffffffed0);
    }
  }
  crnlib::colorized_console::deinit();
  crnlib::crnlib_print_mem_stats();
  bVar1 = local_2d & 1;
  crnlib::dynamic_string::~dynamic_string((dynamic_string *)in_stack_fffffffffffffed0);
  return (uint)(bVar1 == 0);
}

Assistant:

static int main_internal(int argc, char* argv[]) {
  colorized_console::init();

  if (check_for_option(argc, argv, "quiet"))
    console::disable_output();

  if (!check_for_option(argc, argv, "noTitle"))
    print_title();

  dynamic_string cmd_line;
  get_command_line_as_single_string(cmd_line, argc, argv);

  bool status = false;
  if (check_for_option(argc, argv, "corpus_gen")) {
    corpus_gen generator;
    status = generator.generate(cmd_line.get_ptr());
  } else if (check_for_option(argc, argv, "corpus_test")) {
    corpus_tester tester;
    status = tester.test(cmd_line.get_ptr());
  } else {
    crunch converter;
    status = converter.convert(cmd_line.get_ptr());
  }

  colorized_console::deinit();

  crnlib_print_mem_stats();

  return status ? EXIT_SUCCESS : EXIT_FAILURE;
}